

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

void __thiscall HevcVpsUnit::setFPS(HevcVpsUnit *this,double fps)

{
  long lVar1;
  double fps_local;
  HevcVpsUnit *this_local;
  
  lVar1 = lround(fps);
  this->time_scale = (int)lVar1 * 1000000;
  lVar1 = lround((double)this->time_scale / fps);
  this->num_units_in_tick = (uint)lVar1;
  if (0 < this->num_units_in_tick_bit_pos) {
    HevcUnit::updateBits
              ((HevcUnit *)this,this->num_units_in_tick_bit_pos,0x20,this->num_units_in_tick);
    HevcUnit::updateBits
              ((HevcUnit *)this,this->num_units_in_tick_bit_pos + 0x20,0x20,this->time_scale);
    return;
  }
  __assert_fail("num_units_in_tick_bit_pos > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/hevc.cpp"
                ,0xea,"void HevcVpsUnit::setFPS(const double)");
}

Assistant:

void HevcVpsUnit::setFPS(const double fps)
{
    time_scale = lround(fps) * 1000000;
    num_units_in_tick = lround(time_scale / fps);

    assert(num_units_in_tick_bit_pos > 0);
    updateBits(num_units_in_tick_bit_pos, 32, num_units_in_tick);
    updateBits(num_units_in_tick_bit_pos + 32, 32, time_scale);
}